

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O0

elem * cilkred_map::grow(__cilkrts_worker *w,bucket **bp)

{
  __cilkrts_worker *w_00;
  bucket *pbVar1;
  elem *peVar2;
  bucket **ppbVar3;
  long *in_RSI;
  __cilkrts_worker *in_RDI;
  bucket *nb;
  bucket *b;
  size_t nnmax;
  size_t nmax;
  size_t i;
  size_t in_stack_ffffffffffffffc0;
  bucket **bp_00;
  __cilkrts_worker *local_28;
  __cilkrts_worker *local_20;
  
  bp_00 = (bucket **)*in_RSI;
  if (bp_00 == (bucket **)0x0) {
    local_28 = (__cilkrts_worker *)0x0;
  }
  else {
    local_28 = (__cilkrts_worker *)*bp_00;
    for (local_20 = (__cilkrts_worker *)0x0; local_20 < local_28;
        local_20 = (__cilkrts_worker *)((long)&local_20->tail + 1)) {
      if (bp_00[(long)local_20 * 3 + 1] == (bucket *)0x0) {
        return (elem *)(bp_00 + (long)local_20 * 3 + 1);
      }
    }
  }
  verify_current_wkr(in_RDI);
  w_00 = (__cilkrts_worker *)roundup(in_stack_ffffffffffffffc0);
  pbVar1 = alloc_bucket(w_00,(size_t)bp_00);
  for (local_20 = (__cilkrts_worker *)0x0; local_20 < local_28;
      local_20 = (__cilkrts_worker *)((long)&local_20->tail + 1)) {
    ppbVar3 = bp_00 + (long)local_20 * 3 + 1;
    peVar2 = pbVar1->el + (long)local_20;
    peVar2->key = *ppbVar3;
    peVar2->hb = (__cilkrts_hyperobject_base *)ppbVar3[1];
    peVar2->view = ppbVar3[2];
  }
  free_bucket(w_00,bp_00);
  *in_RSI = (long)pbVar1;
  for (; local_20 < w_00; local_20 = (__cilkrts_worker *)((long)&local_20->tail + 1)) {
    pbVar1->el[(long)local_20].key = (void *)0x0;
  }
  pbVar1->el[(long)local_20].key = (void *)0x0;
  return pbVar1->el + (long)local_28;
}

Assistant:

elem *cilkred_map::grow(__cilkrts_worker *w, 
                        bucket          **bp)
{
    size_t i, nmax, nnmax;
    bucket *b, *nb;

    b = *bp;
    if (b) {
        nmax = b->nmax;
        /* find empty element if any */
        for (i = 0; i < nmax; ++i) 
            if (b->el[i].key == 0) 
                return &(b->el[i]);
        /* do not use the last one even if empty */
    } else {
        nmax = 0;
    }

    verify_current_wkr(w);
    /* allocate a new bucket */
    nnmax = roundup(2 * nmax);
    nb = alloc_bucket(w, nnmax);


    /* copy old bucket into new */
    for (i = 0; i < nmax; ++i)
        nb->el[i] = b->el[i];
     
    free_bucket(w, bp); *bp = nb;

    /* zero out extra elements */
    for (; i < nnmax; ++i)
        nb->el[i].key = 0;

    /* zero out the last one */
    nb->el[i].key = 0;
  
    return &(nb->el[nmax]);
}